

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json_schema.c
# Opt level: O1

void jsons_print_imports(lyout *out,lys_module *mod,int *first)

{
  char *pcVar1;
  lys_module *plVar2;
  int iVar3;
  lys_revision *plVar4;
  lys_revision *plVar5;
  lys_import *plVar6;
  ulong uVar7;
  lys_revision *plVar8;
  char *local_58;
  ulong local_50;
  lyout *local_48;
  char *local_40;
  char *str;
  int f;
  
  if ((mod->imp_size != '\0') || (mod->inc_size != '\0')) {
    iVar3 = asprintf(&local_40,"%s\"import\":{",",");
    if (iVar3 == -1) {
      ly_log(mod->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","jsons_print_imports");
    }
    else {
      plVar6 = mod->imp;
      local_50 = (ulong)mod->imp_size;
      str._0_4_ = 1;
      if ((local_50 != 0) && (local_40 != (char *)0x0)) {
        str._0_4_ = 0;
        ly_print(out,local_40);
        free(local_40);
        local_40 = (char *)0x0;
      }
      if (local_50 != 0) {
        plVar8 = (lys_revision *)0x1a4a36;
        uVar7 = 0;
        local_48 = out;
        do {
          plVar4 = (lys_revision *)0x1a3fd0;
          if ((int)str == 0 && (int)uVar7 == 0) {
            plVar4 = plVar8;
          }
          plVar5 = (lys_revision *)"@";
          if (plVar6->rev[0] == '\0') {
            plVar5 = plVar8;
          }
          ly_print(out,"%s\"%s%s%s\":{",plVar4,plVar6->module->name,plVar5,plVar6->rev);
          str._4_4_ = 1;
          pcVar1 = plVar6->prefix;
          if (pcVar1 != (char *)0x0) {
            ly_print(out,"%s\"%s\":{\"%s\":\"%s\"%s","","prefix","value",pcVar1,"}");
          }
          str._4_4_ = (uint)(pcVar1 == (char *)0x0);
          jsons_print_text(out,"description","text",plVar6->dsc,1,(int *)((long)&str + 4));
          jsons_print_text(out,"reference","text",plVar6->ref,1,(int *)((long)&str + 4));
          plVar2 = plVar6->module;
          plVar5 = plVar8;
          plVar4 = plVar8;
          if (plVar2->rev_size != '\0') {
            plVar5 = plVar2->rev;
            plVar4 = (lys_revision *)"@";
          }
          iVar3 = asprintf(&local_58,"%s%s%s",plVar2->name,plVar4,plVar5);
          out = local_48;
          if (iVar3 == -1) {
            ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                   "jsons_print_imports_");
            out = local_48;
            break;
          }
          jsons_print_text(local_48,"resolves-to","module",local_58,1,(int *)((long)&str + 4));
          free(local_58);
          ly_print(out,"}");
          uVar7 = uVar7 + 1;
          plVar6 = plVar6 + 1;
        } while (local_50 != uVar7);
      }
      if (local_40 == (char *)0x0) {
        ly_print(out,"}");
      }
      else {
        free(local_40);
      }
    }
  }
  return;
}

Assistant:

static void
jsons_print_imports(struct lyout *out, const struct lys_module *mod, int *first)
{
    char *str;

    if (!mod->imp_size && !mod->inc_size) {
        return;
    }

    if (asprintf(&str, "%s\"import\":{", (first && (*first)) ? "" : ",") == -1) {
        LOGMEM(mod->ctx);
        return;
    }
    jsons_print_imports_(out, NULL, mod->imp, mod->imp_size, &str);
    /* FIXME key duplication in case multiple submodules imports the same module,
     * but the question is if it is needed to print imports even from submodules -
     * similar code should be then added even for typedefs or identities
    for (i = 0; i < mod->inc_size; ++i) {
        jsons_print_imports_(out, mod->inc[i].submodule, mod->inc[i].submodule->imp, mod->inc[i].submodule->imp_size, &str);
    }
    */
    if (str) {
        free(str);
    } else {
        ly_print(out, "}");
    }
    if (first) {
        (*first) = 0;
    }
}